

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports-runtime.cpp
# Opt level: O0

void __thiscall rtosc::helpers::Capture::map_blobs(Capture *this)

{
  char *pcVar1;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> in_RDI;
  int i;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  *this_00;
  int __n;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar2;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> in_stack_ffffffffffffffe0;
  int local_c;
  
  for (local_c = 0; local_c < *(int *)(in_RDI._M_current + 0x88); local_c = local_c + 1) {
    if (((*(char *)(*(long *)(in_RDI._M_current + 0x80) + (long)local_c * 0x18) == 'b') &&
        (*(long *)(*(long *)(in_RDI._M_current + 0x80) + (long)local_c * 0x18 + 0x10) != 0)) &&
       (*(int *)(*(long *)(in_RDI._M_current + 0x80) + (long)local_c * 0x18 + 8) != 0)) {
      this_00 = *(vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                  **)(in_RDI._M_current + 0x90);
      std::
      vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ::size(*(vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
               **)(in_RDI._M_current + 0x90));
      std::
      vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ::resize((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                *)in_stack_ffffffffffffffe0._M_current,(size_type)in_RDI._M_current);
      std::
      vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ::back(this_00);
      std::vector<char,_std::allocator<char>_>::resize
                ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffffe0._M_current,
                 (size_type)in_RDI._M_current);
      __n = (int)((ulong)*(undefined8 *)
                          (*(long *)(in_RDI._M_current + 0x80) + (long)local_c * 0x18 + 0x10) >>
                 0x20);
      uVar2 = *(undefined4 *)(*(long *)(in_RDI._M_current + 0x80) + (long)local_c * 0x18 + 8);
      std::
      vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ::back(this_00);
      std::vector<char,_std::allocator<char>_>::begin(in_stack_ffffffffffffffb8);
      in_stack_ffffffffffffffe0 =
           std::
           copy_n<unsigned_char*,int,__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                     ((uchar *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),__n,in_RDI);
      std::
      vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ::back(this_00);
      pcVar1 = std::vector<char,_std::allocator<char>_>::data
                         ((vector<char,_std::allocator<char>_> *)0x1198b4);
      *(char **)(*(long *)(in_RDI._M_current + 0x80) + (long)local_c * 0x18 + 0x10) = pcVar1;
    }
  }
  return;
}

Assistant:

void map_blobs()
    {
        for(int i = 0; i < nargs; ++i)
        {
            if(arg_vals[i].type == 'b'
               && arg_vals[i].val.b.data && arg_vals[i].val.b.len)
            {
                scratch_bufs->resize(scratch_bufs->size()+1);
                scratch_bufs->back().resize(arg_vals[i].val.b.len);
                std::copy_n(arg_vals[i].val.b.data,
                            arg_vals[i].val.b.len,
                            scratch_bufs->back().begin());
                arg_vals[i].val.b.data = (uint8_t*)scratch_bufs->back().data();
            }
        }
    }